

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O2

wchar_t assertion_make_hardlink(char *file,wchar_t line,char *newpath,char *linkto)

{
  int iVar1;
  char *extra;
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  iVar1 = link(linkto,newpath);
  if (iVar1 != 0) {
    failure_start(file,line,"Could not create hardlink");
    logprintf("   New link: %s\n",newpath);
    extra = "   Old name: %s\n";
    logprintf("   Old name: %s\n",linkto);
    failure_finish(extra);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

int
assertion_make_hardlink(const char *file, int line,
    const char *newpath, const char *linkto)
{
	int succeeded;

	assertion_count(file, line);
#if defined(_WIN32) && !defined(__CYGWIN__)
	succeeded = my_CreateHardLinkA(newpath, linkto);
#elif HAVE_LINK
	succeeded = !link(linkto, newpath);
#else
	succeeded = 0;
#endif
	if (succeeded)
		return (1);
	failure_start(file, line, "Could not create hardlink");
	logprintf("   New link: %s\n", newpath);
	logprintf("   Old name: %s\n", linkto);
	failure_finish(NULL);
	return(0);
}